

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall
obs::safe_list<obs::slot<void_(int,_int,_double)>_>::node::unlock(node *this,iterator *it)

{
  iterator *piVar1;
  bool bVar2;
  iterator *local_30;
  iterator *it2;
  iterator *next;
  iterator *prev;
  iterator *it_local;
  node *this_local;
  
  if (it == (iterator *)0x0) {
    __assert_fail("it",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x1a3,
                  "void obs::safe_list<obs::slot<void (int, int, double)>>::node::unlock(iterator *) [T = obs::slot<void (int, int, double)>]"
                 );
  }
  bVar2 = in_creator_thread(this);
  if (bVar2) {
    next = (iterator *)0x0;
    local_30 = this->creator_thread_iterator;
    while (local_30 != (iterator *)0x0) {
      piVar1 = local_30->m_next_iterator;
      if (local_30 == it) {
        if (next == (iterator *)0x0) {
          this->creator_thread_iterator = piVar1;
        }
        else {
          next->m_next_iterator = piVar1;
        }
        break;
      }
      next = local_30;
      local_30 = piVar1;
    }
  }
  if (this->locks < 1) {
    __assert_fail("locks > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x1b9,
                  "void obs::safe_list<obs::slot<void (int, int, double)>>::node::unlock(iterator *) [T = obs::slot<void (int, int, double)>]"
                 );
  }
  this->locks = this->locks + -1;
  return;
}

Assistant:

void safe_list<T>::node::unlock(iterator* it) {
  assert(it);

  // In this case we are unlocking just one iterator, if we are in the
  // creator thread, we've to remove this iterator from the "creator
  // thread iterators" linked-list.
  if (in_creator_thread()) {
    iterator* prev = nullptr;
    iterator* next = nullptr;
    for (auto it2=creator_thread_iterator; it2; it2=next) {
      next = it2->m_next_iterator;
      if (it2 == it) {
        if (prev)
          prev->m_next_iterator = next;
        else
          creator_thread_iterator = next;

        break;
      }
      prev = it2;
    }
  }

  assert(locks > 0);
  --locks;
}